

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_posix::create_codecvt
          (impl_posix *this,locale *in,string *encoding,character_facet_type type)

{
  bool bVar1;
  pointer *__ptr;
  string local_50;
  
  conv::impl::normalize_encoding_abi_cxx11_
            (&local_50,(impl *)(encoding->_M_dataplus)._M_p,(char *)encoding);
  bVar1 = std::operator==(&local_50,"utf8");
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    util::create_utf8_codecvt((util *)this,in,type);
  }
  else {
    util::create_simple_codecvt((util *)this,in,encoding,type);
  }
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_codecvt(std::locale const &in,std::string const &encoding,character_facet_type type)
    {
        if(conv::impl::normalize_encoding(encoding.c_str())=="utf8")
            return util::create_utf8_codecvt(in,type);

        try {
            return util::create_simple_codecvt(in,encoding,type);
        }
        catch(conv::invalid_charset_error const &) {
            std::unique_ptr<util::base_converter> cvt;
            cvt = create_iconv_converter(encoding);
            return util::create_codecvt(in,std::move(cvt),type);
        }
    }